

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

bool __thiscall
TFileNameDatabase::CompareAndCopyPathFragmentByIndex
          (TFileNameDatabase *this,TMndxSearch *pSearch,DWORD TableIndex)

{
  TStruct40 *pTVar1;
  bool bVar2;
  DWORD DVar3;
  _HASH_ENTRY *pHashEntry_00;
  byte *pbVar4;
  uchar *puVar5;
  DWORD FragmentOffset;
  PHASH_ENTRY pHashEntry;
  TStruct40 *pStruct40;
  DWORD TableIndex_local;
  TMndxSearch *pSearch_local;
  TFileNameDatabase *this_local;
  
  pTVar1 = pSearch->pStruct40;
  pStruct40._4_4_ = TableIndex;
  do {
    pHashEntry_00 =
         TGenericArray<_HASH_ENTRY>::operator[]
                   (&this->HashTable,(ulong)(pStruct40._4_4_ & this->HashTableMask));
    if (pStruct40._4_4_ == pHashEntry_00->NextIndex) {
      bVar2 = IsPathFragmentSingleChar(this,pHashEntry_00);
      if (bVar2) {
        if ((pHashEntry_00->field_2).SingleChar != pSearch->szSearchMask[pTVar1->PathLength]) {
          return false;
        }
        TGenericArray<char>::Insert(&pTVar1->PathBuffer,(pHashEntry_00->field_2).SingleChar);
        pTVar1->PathLength = pTVar1->PathLength + 1;
      }
      else if (this->pChildDB == (TFileNameDatabase *)0x0) {
        bVar2 = TPathFragmentTable::CompareAndCopyPathFragment
                          (&this->PathFragmentTable,pSearch,
                           (ulong)(pHashEntry_00->field_2).FragmentOffset);
        if (!bVar2) {
          return false;
        }
      }
      else {
        bVar2 = CompareAndCopyPathFragmentByIndex
                          (this->pChildDB,pSearch,(pHashEntry_00->field_2).FragmentOffset);
        if (!bVar2) {
          return false;
        }
      }
      pStruct40._4_4_ = pHashEntry_00->NodeIndex;
      if (pStruct40._4_4_ == 0) {
        return true;
      }
    }
    else {
      bVar2 = IsPathFragmentString(this,(ulong)pStruct40._4_4_);
      if (bVar2) {
        DVar3 = GetPathFragmentOffset1(this,pStruct40._4_4_);
        if (this->pChildDB == (TFileNameDatabase *)0x0) {
          bVar2 = TPathFragmentTable::CompareAndCopyPathFragment
                            (&this->PathFragmentTable,pSearch,(ulong)DVar3);
          if (!bVar2) {
            return false;
          }
        }
        else {
          bVar2 = CompareAndCopyPathFragmentByIndex(this->pChildDB,pSearch,DVar3);
          if (!bVar2) {
            return false;
          }
        }
      }
      else {
        pbVar4 = TGenericArray<unsigned_char>::operator[](&this->LoBitsTable,(ulong)pStruct40._4_4_)
        ;
        if ((uint)*pbVar4 != (int)pSearch->szSearchMask[pTVar1->PathLength]) {
          return false;
        }
        puVar5 = TGenericArray<unsigned_char>::operator[](&this->LoBitsTable,(ulong)pStruct40._4_4_)
        ;
        TGenericArray<char>::Insert(&pTVar1->PathBuffer,*puVar5);
        pTVar1->PathLength = pTVar1->PathLength + 1;
      }
      if (pStruct40._4_4_ <= this->field_214) {
        return true;
      }
      DVar3 = TSparseArray::GetItem1(&this->CollisionTable,pStruct40._4_4_);
      pStruct40._4_4_ = (-1 - pStruct40._4_4_) + DVar3;
    }
    if (pSearch->cchSearchMask <= (ulong)pTVar1->PathLength) {
      CopyPathFragmentByIndex(this,pSearch,pStruct40._4_4_);
      return true;
    }
  } while( true );
}

Assistant:

bool CompareAndCopyPathFragmentByIndex(TMndxSearch * pSearch, DWORD TableIndex)
    {
        TStruct40 * pStruct40 = pSearch->pStruct40;
        PHASH_ENTRY pHashEntry;

        // HOTS: 1959024
        for(;;)
        {
            pHashEntry = &HashTable[TableIndex & HashTableMask];
            if(TableIndex == pHashEntry->NextIndex)
            {
                // HOTS: 1959047
                if(!IsPathFragmentSingleChar(pHashEntry))
                {
                    // HOTS: 195905A
                    if(pChildDB != NULL)
                    {
                        if(!pChildDB->CompareAndCopyPathFragmentByIndex(pSearch, pHashEntry->ChildTableIndex))
                            return false;
                    }
                    else
                    {
                        if(!PathFragmentTable.CompareAndCopyPathFragment(pSearch, pHashEntry->FragmentOffset))
                            return false;
                    }
                }
                else
                {
                    // HOTS: 1959092
                    if(pHashEntry->SingleChar != pSearch->szSearchMask[pStruct40->PathLength])
                        return false;

                    // Insert the low 8 bits to the path being built
                    pStruct40->PathBuffer.Insert(pHashEntry->SingleChar);
                    pStruct40->PathLength++;
                }

                // HOTS: 195912E
                TableIndex = pHashEntry->NodeIndex;
                if(TableIndex == 0)
                    return true;
            }
            else
            {
                // HOTS: 1959147
                if(IsPathFragmentString(TableIndex))
                {
                    // HOTS: 195917C
                    DWORD FragmentOffset = GetPathFragmentOffset1(TableIndex);

                    if(pChildDB != NULL)
                    {
                        if(!pChildDB->CompareAndCopyPathFragmentByIndex(pSearch, FragmentOffset))
                            return false;
                    }
                    else
                    {
                        if(!PathFragmentTable.CompareAndCopyPathFragment(pSearch, FragmentOffset))
                            return false;
                    }
                }
                else
                {
                    // HOTS: 195920E
                    if(LoBitsTable[TableIndex] != pSearch->szSearchMask[pStruct40->PathLength])
                        return false;

                    // Insert one character to the path being built
                    pStruct40->PathBuffer.Insert(LoBitsTable[TableIndex]);
                    pStruct40->PathLength++;
                }

                // HOTS: 19592B6
                if(TableIndex <= field_214)
                    return true;

                TableIndex = 0xFFFFFFFF - TableIndex + CollisionTable.GetItem1(TableIndex);
            }

            // HOTS: 19592D5
            if(pStruct40->PathLength >= pSearch->cchSearchMask)
                break;
        }

        CopyPathFragmentByIndex(pSearch, TableIndex);
        return true;
    }